

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_sqrt_mips(float128 a,float_status *status)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  ulong a_00;
  ulong uVar12;
  long lVar13;
  ulong b;
  bool bVar14;
  bool bVar15;
  float128 fVar16;
  int32_t aExp;
  uint64_t term1;
  uint64_t term0;
  uint local_6c;
  float_status *local_68;
  ulong local_60;
  ulong local_58;
  uint64_t local_50;
  uint64_t local_48;
  ulong local_40;
  uint64_t local_38;
  
  uVar6 = a.high;
  local_48 = a.low;
  local_40 = uVar6 & 0xffffffffffff;
  local_6c = a.high._6_2_ & 0x7fff;
  if (local_6c == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_48 != 0) {
      fVar16 = propagateFloat128NaN(a,a,status);
      return fVar16;
    }
    if (-1 < (long)uVar6) {
      return a;
    }
  }
  else {
    if (-1 < (long)uVar6) {
      local_68 = status;
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            local_48 == 0) {
          return (float128)ZEXT816(0);
        }
        normalizeFloat128Subnormal(local_40,local_48,(int32_t *)&local_6c,&local_40,&local_48);
      }
      uVar4 = local_48;
      uVar2 = local_6c;
      iVar1 = local_6c - 0x3fff;
      uVar6 = local_40 | 0x1000000000000;
      uVar3 = estimateSqrt32(local_6c,(uint32_t)(uVar6 >> 0x11));
      bVar11 = (byte)uVar2 & 1;
      uVar10 = uVar4 << (bVar11 ^ 0xd);
      bVar11 = bVar11 + 0x33 & 0x3f;
      uVar12 = uVar4 >> bVar11 | uVar6 << 0x40 - bVar11;
      uVar4 = estimateDiv128To64(uVar12,uVar10,(ulong)uVar3 << 0x20);
      a_00 = (ulong)uVar3 * 0x40000000 + uVar4;
      mul64To128(a_00,a_00,&local_38,&local_58);
      uVar6 = uVar10 - local_58;
      uVar4 = a_00 * 2;
      for (lVar13 = (uVar12 - local_38) - (ulong)(uVar10 < local_58); lVar13 < 0;
          lVar13 = (lVar13 - ((long)a_00 >> 0x3f)) + (ulong)bVar14) {
        a_00 = a_00 - 1;
        bVar14 = CARRY8(uVar6,uVar4 - 1);
        uVar6 = uVar6 + (uVar4 - 1);
        uVar4 = uVar4 - 2;
      }
      uVar5 = estimateDiv128To64(uVar6,0,uVar4);
      if (((uint)uVar5 & 0x1ffe) < 6) {
        b = uVar5 + (uVar5 == 0);
        mul64To128(uVar4,b,&local_58,&local_60);
        bVar14 = local_60 != 0;
        uVar12 = -local_60;
        mul64To128(b,b,&local_60,&local_50);
        uVar8 = uVar12 - local_60;
        uVar7 = -local_50;
        uVar9 = uVar8 - (local_50 != 0);
        uVar10 = b * 2 - 1;
        uVar5 = b;
        for (lVar13 = (((uVar6 - local_58) - (ulong)bVar14) - (ulong)(uVar12 < local_60)) -
                      (ulong)(uVar8 < (local_50 != 0)); uVar5 = uVar5 - 1, lVar13 < 0;
            lVar13 = lVar13 + (ulong)bVar14 + (ulong)(uVar9 < bVar15)) {
          bVar14 = -((long)uVar5 >> 0x3f) + uVar9 + uVar4 < uVar9;
          uVar9 = -((long)uVar5 >> 0x3f) + uVar9 + (ulong)CARRY8(uVar10,uVar7) + uVar4;
          bVar15 = CARRY8(uVar7,uVar10);
          uVar7 = uVar7 + uVar10;
          b = b - 1;
          uVar10 = uVar10 - 2;
        }
        uVar5 = b | ((uVar9 != 0 || lVar13 != 0) || uVar7 != 0);
      }
      fVar16 = roundAndPackFloat128
                         ('\0',(iVar1 >> 1) + 0x3ffe,a_00 >> 0xe,a_00 << 0x32 | uVar5 >> 0xe,
                          uVar5 << 0x32,local_68);
      return fVar16;
    }
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_48 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
      return a;
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  fVar16 = float128_default_nan_mips(status);
  return fVar16;
}

Assistant:

float128 float128_sqrt(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, zSig2, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( 0, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFE;
    aSig0 |= UINT64_C(0x0001000000000000);
    zSig0 = estimateSqrt32( aExp, aSig0>>17 );
    shortShift128Left( aSig0, aSig1, 13 - ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & 0x1FFF ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 14, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(0, zExp, zSig0, zSig1, zSig2, status);

}